

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O1

void __thiscall jpge::jpeg_encoder::emit_sos(jpeg_encoder *this)

{
  char cVar1;
  undefined1 uVar2;
  int iVar3;
  _func_int **pp_Var4;
  uint uVar5;
  undefined1 *puVar6;
  output_stream *poVar7;
  uint uVar8;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  emit_marker(this,0xda);
  emit_word(this,(uint)this->m_num_components * 2 + 6);
  if (this->m_all_stream_writes_succeeded == true) {
    iVar3 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_37,1);
    uVar2 = (undefined1)iVar3;
  }
  else {
    uVar2 = false;
  }
  this->m_all_stream_writes_succeeded = (bool)uVar2;
  if (this->m_num_components != '\0') {
    uVar8 = 0;
    do {
      uVar5 = uVar8 + 1;
      if (this->m_all_stream_writes_succeeded == true) {
        iVar3 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_33,1);
        cVar1 = (char)iVar3;
      }
      else {
        cVar1 = false;
      }
      this->m_all_stream_writes_succeeded = (bool)cVar1;
      if (uVar8 == 0) {
        if ((bool)cVar1 == false) goto LAB_0012cd62;
        poVar7 = this->m_pStream;
        pp_Var4 = poVar7->_vptr_output_stream;
        puVar6 = &local_32;
LAB_0012cd58:
        iVar3 = (*pp_Var4[2])(poVar7,puVar6,1);
        uVar2 = (undefined1)iVar3;
      }
      else {
        if ((bool)cVar1 != false) {
          poVar7 = this->m_pStream;
          pp_Var4 = poVar7->_vptr_output_stream;
          puVar6 = &local_31;
          goto LAB_0012cd58;
        }
LAB_0012cd62:
        uVar2 = false;
      }
      this->m_all_stream_writes_succeeded = (bool)uVar2;
      uVar8 = uVar5;
    } while (uVar5 < this->m_num_components);
  }
  if (this->m_all_stream_writes_succeeded == true) {
    iVar3 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_36,1);
    cVar1 = (char)iVar3;
  }
  else {
    cVar1 = false;
  }
  this->m_all_stream_writes_succeeded = (bool)cVar1;
  if ((bool)cVar1 == false) {
    cVar1 = false;
  }
  else {
    iVar3 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_35,1);
    cVar1 = (char)iVar3;
  }
  this->m_all_stream_writes_succeeded = (bool)cVar1;
  if ((bool)cVar1 == false) {
    uVar2 = false;
  }
  else {
    iVar3 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,&local_34,1);
    uVar2 = (undefined1)iVar3;
  }
  this->m_all_stream_writes_succeeded = (bool)uVar2;
  return;
}

Assistant:

void jpeg_encoder::emit_sos() {
  emit_marker(M_SOS);
  emit_word(2 * m_num_components + 2 + 1 + 3);
  emit_byte(m_num_components);
  for (int i = 0; i < m_num_components; i++) {
    emit_byte(static_cast<uint8>(i + 1));
    if (i == 0)
      emit_byte((0 << 4) + 0);
    else
      emit_byte((1 << 4) + 1);
  }
  emit_byte(0); /* spectral selection */
  emit_byte(63);
  emit_byte(0);
}